

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjToReal(jx9_value *pObj)

{
  uint uVar1;
  sxu32 nLen;
  int iVar2;
  jx9_hashmap *pMap;
  char **in_RCX;
  double dVar3;
  double local_18;
  jx9_real local_10;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 10) == 0) {
      if ((uVar1 & 1) == 0) {
        dVar3 = 0.0;
        if ((uVar1 & 0x20) == 0) {
          if ((uVar1 & 0x40) == 0) {
            if (((uVar1 >> 8 & 1) != 0) && ((pObj->x).iVal != 0)) {
              dVar3 = 1.0;
            }
          }
          else {
            pMap = (jx9_hashmap *)(pObj->x).iVal;
            iVar2 = pMap->iRef;
            pMap->iRef = iVar2 + -1;
            dVar3 = (double)pMap->nEntry;
            if (iVar2 < 2) {
              local_10 = (double)pMap->nEntry;
              jx9HashmapRelease(pMap,1);
              dVar3 = local_10;
            }
          }
        }
      }
      else {
        local_18 = 0.0;
        nLen = (pObj->sBlob).nByte;
        dVar3 = local_18;
        if (nLen != 0) {
          SyStrToReal((char *)(pObj->sBlob).pBlob,nLen,&local_18,in_RCX);
          dVar3 = local_18;
        }
      }
    }
    else {
      dVar3 = (double)(pObj->x).iVal;
    }
    (pObj->x).rVal = dVar3;
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 4;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToReal(jx9_value *pObj)
{
	if((pObj->iFlags & MEMOBJ_REAL) == 0 ){
		/* Preform the conversion */
		pObj->x.rVal = MemObjRealValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_REAL);
	}
	return SXRET_OK;
}